

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

CPAccessResult access_pauth(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  int iVar1;
  uint64_t uVar2;
  
  iVar1 = arm_current_el(env);
  if (iVar1 < 2) {
    if (((env->features & 0x100000000) != 0) &&
       (uVar2 = arm_hcr_el2_eff_aarch64(env), (uVar2 >> 0x28 & 1) == 0)) {
      return CP_ACCESS_TRAP_EL2;
    }
  }
  else if (iVar1 != 2) {
    return CP_ACCESS_OK;
  }
  if (((env->features & 0x200000000) != 0) && (((env->cp15).scr_el3 & 0x10000) == 0)) {
    return CP_ACCESS_TRAP_EL3;
  }
  return CP_ACCESS_OK;
}

Assistant:

static CPAccessResult access_pauth(CPUARMState *env, const ARMCPRegInfo *ri,
                                   bool isread)
{
    int el = arm_current_el(env);

    if (el < 2 &&
        arm_feature(env, ARM_FEATURE_EL2) &&
        !(arm_hcr_el2_eff(env) & HCR_APK)) {
        return CP_ACCESS_TRAP_EL2;
    }
    if (el < 3 &&
        arm_feature(env, ARM_FEATURE_EL3) &&
        !(env->cp15.scr_el3 & SCR_APK)) {
        return CP_ACCESS_TRAP_EL3;
    }
    return CP_ACCESS_OK;
}